

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O1

void duckdb::StandardFixedSizeAppend::Append<duckdb::uhugeint_t>
               (SegmentStatistics *stats,data_ptr_t target,idx_t target_offset,
               UnifiedVectorFormat *adata,idx_t offset,idx_t count)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  uint64_t uVar5;
  undefined8 uVar6;
  uhugeint_t *puVar7;
  bool bVar8;
  uhugeint_t *puVar9;
  uhugeint_t *puVar10;
  ulong uVar11;
  data_ptr_t pdVar12;
  idx_t iVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  uhugeint_t local_68;
  uhugeint_t *local_50;
  uhugeint_t *local_48;
  UnifiedVectorFormat *local_40;
  data_ptr_t local_38;
  
  pdVar2 = adata->data;
  local_40 = adata;
  local_38 = pdVar2;
  if ((adata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      pdVar12 = target + target_offset * 0x10;
      local_50 = (uhugeint_t *)&(stats->statistics).stats_union.numeric_data.min;
      local_48 = (uhugeint_t *)&(stats->statistics).stats_union.numeric_data.max;
      do {
        puVar10 = local_50;
        psVar3 = local_40->sel->sel_vector;
        uVar11 = offset;
        if (psVar3 != (sel_t *)0x0) {
          uVar11 = (ulong)psVar3[offset];
        }
        local_68.lower = *(uint64_t *)(pdVar2 + uVar11 * 0x10);
        local_68.upper = *(uint64_t *)((long)(pdVar2 + uVar11 * 0x10) + 8);
        bVar8 = uhugeint_t::operator>(local_50,&local_68);
        puVar7 = local_48;
        puVar9 = puVar10;
        if (bVar8) {
          puVar9 = &local_68;
        }
        uVar5 = puVar9->upper;
        puVar10->lower = puVar9->lower;
        puVar10->upper = uVar5;
        bVar8 = uhugeint_t::operator>(&local_68,local_48);
        puVar10 = puVar7;
        if (bVar8) {
          puVar10 = &local_68;
        }
        uVar5 = puVar10->upper;
        puVar7->lower = puVar10->lower;
        puVar7->upper = uVar5;
        uVar6 = *(undefined8 *)(pdVar2 + uVar11 * 0x10 + 8);
        *(undefined8 *)pdVar12 = *(undefined8 *)(pdVar2 + uVar11 * 0x10);
        *(undefined8 *)(pdVar12 + 8) = uVar6;
        offset = offset + 1;
        pdVar12 = pdVar12 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (count != 0) {
    local_50 = (uhugeint_t *)&(stats->statistics).stats_union.numeric_data.min;
    local_48 = (uhugeint_t *)&(stats->statistics).stats_union.numeric_data.max;
    pdVar12 = target + target_offset * 0x10;
    do {
      puVar10 = local_50;
      psVar3 = local_40->sel->sel_vector;
      iVar13 = offset;
      if (psVar3 != (sel_t *)0x0) {
        iVar13 = (idx_t)psVar3[offset];
      }
      puVar4 = (local_40->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 == (unsigned_long *)0x0) || ((puVar4[iVar13 >> 6] >> (iVar13 & 0x3f) & 1) != 0)) {
        local_68.lower = *(uint64_t *)(pdVar2 + iVar13 * 0x10);
        local_68.upper = *(uint64_t *)((long)(pdVar2 + iVar13 * 0x10) + 8);
        bVar8 = uhugeint_t::operator>(local_50,&local_68);
        puVar7 = local_48;
        puVar9 = puVar10;
        if (bVar8) {
          puVar9 = &local_68;
        }
        uVar5 = puVar9->upper;
        puVar10->lower = puVar9->lower;
        puVar10->upper = uVar5;
        bVar8 = uhugeint_t::operator>(&local_68,local_48);
        puVar10 = puVar7;
        if (bVar8) {
          puVar10 = &local_68;
        }
        uVar5 = puVar10->upper;
        puVar7->lower = puVar10->lower;
        puVar7->upper = uVar5;
        pdVar1 = pdVar2 + iVar13 * 0x10;
        uVar14 = *(undefined4 *)pdVar1;
        uVar15 = *(undefined4 *)(pdVar1 + 4);
        uVar16 = *(undefined4 *)(pdVar1 + 8);
        uVar17 = *(undefined4 *)(pdVar1 + 0xc);
      }
      else {
        uVar14 = 0;
        uVar15 = 0;
        uVar16 = 0;
        uVar17 = 0;
      }
      *(undefined4 *)pdVar12 = uVar14;
      *(undefined4 *)(pdVar12 + 4) = uVar15;
      *(undefined4 *)(pdVar12 + 8) = uVar16;
      *(undefined4 *)(pdVar12 + 0xc) = uVar17;
      pdVar12 = pdVar12 + 0x10;
      offset = offset + 1;
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

static void Append(SegmentStatistics &stats, data_ptr_t target, idx_t target_offset, UnifiedVectorFormat &adata,
	                   idx_t offset, idx_t count) {
		auto sdata = UnifiedVectorFormat::GetData<T>(adata);
		auto tdata = reinterpret_cast<T *>(target);
		if (!adata.validity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto source_idx = adata.sel->get_index(offset + i);
				auto target_idx = target_offset + i;
				bool is_null = !adata.validity.RowIsValid(source_idx);
				if (!is_null) {
					stats.statistics.UpdateNumericStats<T>(sdata[source_idx]);
					tdata[target_idx] = sdata[source_idx];
				} else {
					// we insert a NullValue<T> in the null gap for debuggability
					// this value should never be used or read anywhere
					tdata[target_idx] = NullValue<T>();
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto source_idx = adata.sel->get_index(offset + i);
				auto target_idx = target_offset + i;
				stats.statistics.UpdateNumericStats<T>(sdata[source_idx]);
				tdata[target_idx] = sdata[source_idx];
			}
		}
	}